

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockMgr::GetLockControllerForFile
          (CSharedMemoryFileLockMgr *this,CPalThread *pThread,LPCSTR szFileName,DWORD dwAccessRights
          ,DWORD dwShareMode,IFileLockController **ppLockController)

{
  bool bVar1;
  CSharedMemoryFileLockController *local_50;
  CSharedMemoryFileLockController *pController;
  SHMFILELOCKS *fileLocks;
  SHMPTR shmFileLocks;
  IFileLockController **ppIStack_30;
  PAL_ERROR palError;
  IFileLockController **ppLockController_local;
  DWORD dwShareMode_local;
  DWORD dwAccessRights_local;
  LPCSTR szFileName_local;
  CPalThread *pThread_local;
  CSharedMemoryFileLockMgr *this_local;
  
  shmFileLocks._4_4_ = 0;
  fileLocks = (SHMFILELOCKS *)0x0;
  local_50 = (CSharedMemoryFileLockController *)0x0;
  ppIStack_30 = ppLockController;
  ppLockController_local._0_4_ = dwShareMode;
  ppLockController_local._4_4_ = dwAccessRights;
  _dwShareMode_local = szFileName;
  szFileName_local = (LPCSTR)pThread;
  pThread_local = (CPalThread *)this;
  SHMLock();
  shmFileLocks._4_4_ = FILEGetSHMFileLocks(_dwShareMode_local,(SHMPTR *)&fileLocks,0);
  if (shmFileLocks._4_4_ == 0) {
    if (fileLocks == (SHMFILELOCKS *)0x0) {
      pController = (CSharedMemoryFileLockController *)0x0;
      bVar1 = true;
    }
    else {
      pController = (CSharedMemoryFileLockController *)SHMPtrToPtr((SHMPTR)fileLocks);
      bVar1 = pController != (CSharedMemoryFileLockController *)0x0;
    }
    if ((bVar1) && (pController != (CSharedMemoryFileLockController *)0x0)) {
      if ((int)pController[1].m_shmFileLocks == -1) {
        *(DWORD *)&pController[1].m_shmFileLocks = (DWORD)ppLockController_local;
      }
      else {
        if ((int)pController[1].m_shmFileLocks == 0) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
        if (((ppLockController_local._4_4_ & 0x80000000) != 0) &&
           ((pController[1].m_shmFileLocks & 1) == 0)) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
        if (((ppLockController_local._4_4_ & 0x40000000) != 0) &&
           ((pController[1].m_shmFileLocks & 2) == 0)) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
        if (((((DWORD)ppLockController_local & 1) != 0) &&
            (((DWORD)ppLockController_local & 2) == 0)) &&
           ((pController[1].m_shmFileLocks & 1) == 0)) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
        if (((((DWORD)ppLockController_local & 2) != 0) &&
            (((DWORD)ppLockController_local & 1) == 0)) &&
           ((pController[1].m_shmFileLocks & 2) == 0)) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
        if ((*(int *)((long)&pController[1].m_shmFileLocks + 4) != 0) &&
           (((DWORD)ppLockController_local & 1) == 0)) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
        if ((*(int *)&pController[2].super_IFileLockController._vptr_IFileLockController != 0) &&
           (((DWORD)ppLockController_local & 2) == 0)) {
          shmFileLocks._4_4_ = 0x20;
          goto LAB_00146e74;
        }
      }
      if ((((DWORD)ppLockController_local & 1) != 0) && ((pController[1].m_shmFileLocks & 1) == 0))
      {
        ppLockController_local._0_4_ = (DWORD)pController[1].m_shmFileLocks;
      }
      if ((((DWORD)ppLockController_local & 2) != 0) && ((pController[1].m_shmFileLocks & 2) == 0))
      {
        ppLockController_local._0_4_ = (DWORD)pController[1].m_shmFileLocks;
      }
      local_50 = InternalNew<CorUnix::CSharedMemoryFileLockController,unsigned_int,unsigned_long>
                           (ppLockController_local._4_4_,(unsigned_long)fileLocks);
      if (local_50 == (CSharedMemoryFileLockController *)0x0) {
        shmFileLocks._4_4_ = 0xe;
      }
      else {
        fileLocks = (SHMFILELOCKS *)0x0;
        *(DWORD *)&pController[1].m_shmFileLocks = (DWORD)ppLockController_local;
        if ((ppLockController_local._4_4_ & 0x80000000) != 0) {
          *(int *)((long)&pController[1].m_shmFileLocks + 4) =
               *(int *)((long)&pController[1].m_shmFileLocks + 4) + 1;
        }
        if ((ppLockController_local._4_4_ & 0x40000000) != 0) {
          *(int *)&pController[2].super_IFileLockController._vptr_IFileLockController =
               *(int *)&pController[2].super_IFileLockController._vptr_IFileLockController + 1;
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetLockControllerForFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x78);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      shmFileLocks._4_4_ = 0x54f;
    }
  }
LAB_00146e74:
  if (shmFileLocks._4_4_ == 0) {
    *ppIStack_30 = &local_50->super_IFileLockController;
  }
  else {
    if (local_50 != (CSharedMemoryFileLockController *)0x0) {
      (*(local_50->super_IFileLockController)._vptr_IFileLockController[3])();
    }
    if (fileLocks != (SHMFILELOCKS *)0x0) {
      FILECleanUpLockedRgn((SHMPTR)fileLocks,0,(PVOID)0x0);
    }
  }
  SHMRelease();
  return shmFileLocks._4_4_;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockMgr::GetLockControllerForFile(
    CPalThread *pThread,                // IN, OPTIONAL
    LPCSTR szFileName,
    DWORD dwAccessRights,
    DWORD dwShareMode,
    IFileLockController **ppLockController  // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmFileLocks = SHMNULL;
    SHMFILELOCKS* fileLocks = NULL;
    CSharedMemoryFileLockController *pController = NULL;

    SHMLock();

    palError = FILEGetSHMFileLocks(szFileName, &shmFileLocks, FALSE);
    if (NO_ERROR != palError)
    {
        goto GetLockControllerForFileExit;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE || fileLocks == NULL)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto GetLockControllerForFileExit;
    }
        
    if(SHARE_MODE_NOT_INITALIZED == fileLocks->share_mode)
    {
        /* this is the first time this file is open */
        fileLocks->share_mode = (int) dwShareMode;
    }
    /* start checking for dwDesired access and dwShareMode conditions */
    else if(0 == fileLocks->share_mode)
    {
        /* file is exclusively locked */
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;
    }
    /* check for if the desired access is allowed by the share mode */
    else if( (dwAccessRights & GENERIC_READ) && 
             !(fileLocks->share_mode & FILE_SHARE_READ) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (dwAccessRights & GENERIC_WRITE) && 
             !(fileLocks->share_mode & FILE_SHARE_WRITE) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    /* The case when changing to a conflicting share mode is particular.
       The general rule is: changing from conflicting share mode is invalid
       (i.e changing from FILE_SHARE_WRITE to FILE_SHARE_READ is invalid).
       However, if one of the share flags is the same
       (i.e changing from FILE_SHARE_WRITE to FILE_SHARE_READ | FILE_SHARE_WRITE)
       the result is valid. (Please note that FILE_SHARE_READ is ignored
       in this case).
    */
    else if( (dwShareMode & FILE_SHARE_READ) && 
             !(dwShareMode & FILE_SHARE_WRITE) &&
             !(fileLocks->share_mode & FILE_SHARE_READ))
                         
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (dwShareMode & FILE_SHARE_WRITE) && 
             !(dwShareMode & FILE_SHARE_READ) &&
             !(fileLocks->share_mode & FILE_SHARE_WRITE))
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    /* Changing to a less permissive sharing permissions is valid
       if the file handle doesn't have an access right that conflicts with
       the sharing permissions we are trying to set
       (ex: changing from FILE_SHARE_READ|FILE_SHARE_WRITE to FILE_SHARE_WRITE
       isn't valid if the file descriptor still has a GENERIC_READ permission).
    */     
    else if( (fileLocks->nbReadAccess) && 
             !(dwShareMode & FILE_SHARE_READ) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (fileLocks->nbWriteAccess) && 
             !(dwShareMode & FILE_SHARE_WRITE) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }

    /* we are trying to change to a less restrictive sharing permission set 
       keep the current permissions */  
    if( (dwShareMode & FILE_SHARE_READ) && 
              !(fileLocks->share_mode & FILE_SHARE_READ) )
    {
        dwShareMode = fileLocks->share_mode;
    }

    if( (dwShareMode & FILE_SHARE_WRITE) && 
              !(fileLocks->share_mode & FILE_SHARE_WRITE) )
    {
        dwShareMode = fileLocks->share_mode;
    }

    pController = InternalNew<CSharedMemoryFileLockController>(dwAccessRights, shmFileLocks);
    if (NULL == pController)
    {
        palError = ERROR_OUTOFMEMORY;
        goto GetLockControllerForFileExit;
    }

    //
    // pController now owns the shared memory pointer, so make sure we
    // don't attempt to free it below.
    //

    shmFileLocks = SHMNULL;

    /* set the share mode again, it's possible that the share mode is now more
    restrictive than the previous mode set. */
    fileLocks->share_mode = dwShareMode;
    if( dwAccessRights & GENERIC_READ )
    {
        fileLocks->nbReadAccess++;  
    }
    if( dwAccessRights & GENERIC_WRITE )
    {
        fileLocks->nbWriteAccess++;
    }

    // ************** NOTE **************
    // If you add any error paths after this point you must communicate the value of dwAccessRights to
    // FILECleanUpLockedRgn() in the cleanup code below so that it can correctly undo the changes to
    // fileLocks->nbReadAccess and nbWriteAccess made above.
    // ************** NOTE **************

GetLockControllerForFileExit:

    if (NO_ERROR == palError)
    {
        *ppLockController = pController;
    }
    else
    {
        if (NULL != pController)
        {
            pController->ReleaseController();
        }

        if (SHMNULL != shmFileLocks)
        {
            FILECleanUpLockedRgn(
                shmFileLocks,
                0,
                NULL
                );
        }
    }

    SHMRelease();

    return palError;
}